

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O0

bool __thiscall
EOClient::Upload(EOClient *this,FileType type,string *filename,size_t file_start,size_t file_length,
                InitReply init_reply)

{
  int iVar1;
  runtime_error *prVar2;
  char *__filename;
  FILE *pFVar3;
  reference __ptr;
  size_type sVar4;
  size_t sVar5;
  iterator __first;
  iterator __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  char *local_c0;
  undefined4 local_b8;
  uint local_b4;
  undefined1 local_b0 [4];
  int bytes_read;
  undefined1 local_90 [8];
  PacketBuilder builder;
  size_t temp_buffer_size;
  array<char,_10UL> pub_header_bytes;
  size_t sStack_38;
  InitReply init_reply_local;
  size_t file_length_local;
  size_t file_start_local;
  string *filename_local;
  FileType type_local;
  EOClient *this_local;
  
  if (this->upload_fh != (FILE *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Already uploading file");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xf9f8 < file_length) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"File is too large to send");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(__filename,"rb");
  this->upload_fh = (FILE *)pFVar3;
  if (this->upload_fh == (FILE *)0x0) {
    return false;
  }
  if (file_length == 0) {
    iVar1 = fseek((FILE *)this->upload_fh,0,2);
    if (iVar1 != 0) {
      fclose((FILE *)this->upload_fh);
      return false;
    }
    sStack_38 = ftell((FILE *)this->upload_fh);
    fseek((FILE *)this->upload_fh,0,0);
  }
  else {
    sVar4 = std::array<char,_10UL>::size((array<char,_10UL> *)((long)&temp_buffer_size + 2));
    sStack_38 = sVar4 + file_length;
  }
  this->upload_type = type;
  this->upload_pos = 0;
  this->upload_size = sStack_38;
  for (builder.add_size = std::__cxx11::string::size(); builder.add_size < this->upload_size + 6;
      builder.add_size = builder.add_size << 1) {
  }
  std::__cxx11::string::resize((ulong)&this->send_buffer2);
  this->send_buffer2_gpos = 0;
  this->send_buffer2_ppos = 0;
  this->send_buffer2_used = 0;
  std::swap<char,std::char_traits<char>,std::allocator<char>>
            (&(this->super_Client).send_buffer,&this->send_buffer2);
  std::swap<unsigned_long>(&(this->super_Client).send_buffer_gpos,&this->send_buffer2_gpos);
  std::swap<unsigned_long>(&(this->super_Client).send_buffer_ppos,&this->send_buffer2_ppos);
  std::swap<unsigned_long>(&(this->super_Client).send_buffer_used,&this->send_buffer2_used);
  PacketBuilder::PacketBuilder((PacketBuilder *)local_90,PACKET_F_INIT,PACKET_A_INIT,2);
  PacketBuilder::AddChar((PacketBuilder *)local_90,(uint)init_reply);
  if (type != FILE_MAP) {
    PacketBuilder::AddChar((PacketBuilder *)local_90,this->upload_file_id);
  }
  PacketBuilder::AddSize((PacketBuilder *)local_90,this->upload_size);
  PacketBuilder::operator_cast_to_string((string *)local_b0,(PacketBuilder *)local_90);
  Client::Send(&this->super_Client,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  if (file_start != 0) {
    __ptr = std::array<char,_10UL>::operator[]((array<char,_10UL> *)((long)&temp_buffer_size + 2),0)
    ;
    sVar4 = std::array<char,_10UL>::size((array<char,_10UL> *)((long)&temp_buffer_size + 2));
    sVar5 = fread(__ptr,1,sVar4,(FILE *)this->upload_fh);
    local_b4 = (uint)sVar5;
    if (local_b4 < 10) {
      this_local._7_1_ = false;
      goto LAB_0015f3de;
    }
    __first = std::array<char,_10UL>::begin((array<char,_10UL> *)((long)&temp_buffer_size + 2));
    __last = std::array<char,_10UL>::end((array<char,_10UL> *)((long)&temp_buffer_size + 2));
    local_c8._M_current = (char *)std::__cxx11::string::begin();
    local_c0 = (char *)__gnu_cxx::
                       __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator+(&local_c8,(this->super_Client).send_buffer_ppos);
    std::copy<char*,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (__first,__last,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_c0);
    this->upload_pos = (long)(int)local_b4 + this->upload_pos;
    (this->super_Client).send_buffer_ppos =
         (long)(int)local_b4 + (this->super_Client).send_buffer_ppos;
    (this->super_Client).send_buffer_used =
         (long)(int)local_b4 + (this->super_Client).send_buffer_used;
    sVar4 = std::array<char,_10UL>::size((array<char,_10UL> *)((long)&temp_buffer_size + 2));
    if (file_start != sVar4) {
      fseek((FILE *)this->upload_fh,file_start,0);
    }
  }
  this_local._7_1_ = true;
LAB_0015f3de:
  local_b8 = 1;
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_90);
  return this_local._7_1_;
}

Assistant:

bool EOClient::Upload(FileType type, const std::string &filename, std::size_t file_start, std::size_t file_length, InitReply init_reply)
{
	using std::swap;

	if (this->upload_fh)
		throw std::runtime_error("Already uploading file");

	if (file_length > 63992)
		throw std::runtime_error("File is too large to send");

	this->upload_fh = std::fopen(filename.c_str(), "rb");

	if (!this->upload_fh)
		return false;

	// The size of all pub file headers is 10 bytes
	std::array<char, 10> pub_header_bytes;

	if (file_length == 0)
	{
		if (std::fseek(this->upload_fh, 0, SEEK_END) != 0)
		{
			std::fclose(this->upload_fh);
			return false;
		}

		file_length = std::ftell(this->upload_fh);
		std::fseek(this->upload_fh, 0, SEEK_SET);
	}
	else
	{
		file_length += pub_header_bytes.size();
	}

	this->upload_type = type;
	this->upload_pos = 0;
	this->upload_size = file_length;

	std::size_t temp_buffer_size = this->send_buffer.size();

	// Allocate a power-of-two buffer size large enough to hold the file
	while (temp_buffer_size < this->upload_size + 6)
		temp_buffer_size *= 2;

	this->send_buffer2.resize(temp_buffer_size);
	this->send_buffer2_gpos = 0;
	this->send_buffer2_ppos = 0;
	this->send_buffer2_used = 0;

	swap(this->send_buffer, this->send_buffer2);
	swap(this->send_buffer_gpos, this->send_buffer2_gpos);
	swap(this->send_buffer_ppos, this->send_buffer2_ppos);
	swap(this->send_buffer_used, this->send_buffer2_used);

	// Build the file upload header packet
	PacketBuilder builder(PACKET_F_INIT, PACKET_A_INIT, 2);
	builder.AddChar(init_reply);

	if (type != FILE_MAP)
		builder.AddChar(this->upload_file_id);

	builder.AddSize(this->upload_size);

	Client::Send(builder);

	// Copy the header from dat001 in to higher numbered files
	if (file_start != 0)
	{
		int bytes_read = std::fread(&pub_header_bytes[0], 1, pub_header_bytes.size(), this->upload_fh);

		if (bytes_read < sizeof pub_header_bytes)
			return false;

		std::copy(pub_header_bytes.begin(), pub_header_bytes.end(), this->send_buffer.begin() + this->send_buffer_ppos);

		this->upload_pos += bytes_read;
		this->send_buffer_ppos += bytes_read;
		this->send_buffer_used += bytes_read;

		if (file_start != pub_header_bytes.size())
			std::fseek(this->upload_fh, file_start, SEEK_SET);
	}

	return true;
}